

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::coordinateBindingTest<false>(ViewTest *this)

{
  int *data;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_06;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_07;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_08;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_09;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_13;
  size_t sVar1;
  reference piVar2;
  int *piVar3;
  int y_3;
  int args_1;
  int y_5;
  int args;
  long lVar4;
  int x;
  int iVar5;
  allocator_type local_d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  begin._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin._M_current = 0x18;
  data = this->data_;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,0,7);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  local_d9 = (allocator_type)(sVar1 == 0 && w.geometry_.size_ == 1);
  test((bool *)&local_d9);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
  local_d9 = (allocator_type)(*piVar2 == 7);
  test((bool *)&local_d9);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_00._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_00._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_00._M_current = 6;
  begin_00._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,0,3);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  local_d9 = (allocator_type)(w.geometry_.size_ == 4 && sVar1 == 1);
  test((bool *)&local_d9);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
  if (*piVar2 == 3) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,1);
    if (*piVar2 != 9) goto LAB_00179f1e;
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,2);
    if (*piVar2 != 0xf) goto LAB_00179f1e;
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,3);
    local_d9 = (allocator_type)(*piVar2 == 0x15);
  }
  else {
LAB_00179f1e:
    local_d9 = (allocator_type)0x0;
  }
  test((bool *)&local_d9);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_01._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_01._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_01._M_current = 6;
  begin_01._M_current[1] = 4;
  w.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w,&andres::defaultOrder,
             &local_d9);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,0,3);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  local_d9 = (allocator_type)(w.geometry_.size_ == 4 && sVar1 == 1);
  test((bool *)&local_d9);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&w,0);
  if (*piVar2 == 0xc) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,1);
    if (*piVar2 == 0xd) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,2);
      if (*piVar2 == 0xe) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&w,3);
        local_d9 = (allocator_type)(*piVar2 == 0xf);
        goto LAB_0017a026;
      }
    }
  }
  local_d9 = (allocator_type)0x0;
LAB_0017a026:
  test((bool *)&local_d9);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_02._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_02._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_02._M_current = 6;
  begin_02._M_current[1] = 4;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,1,2);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  local_d9 = (allocator_type)(w.geometry_.size_ == 6 && sVar1 == 1);
  test((bool *)&local_d9);
  for (lVar4 = 0; (int)lVar4 != 6; lVar4 = lVar4 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,(int)lVar4);
    local_d9 = (allocator_type)(*piVar2 == this->data_[lVar4 + 0xc]);
    test((bool *)&local_d9);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin_03._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_03._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_03._M_current = 6;
  begin_03._M_current[1] = 4;
  w.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w,&andres::defaultOrder,
             &local_d9);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,1,2);
  sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
  local_d9 = (allocator_type)(w.geometry_.size_ == 6 && sVar1 == 1);
  test((bool *)&local_d9);
  piVar3 = &DAT_001cb4c0;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&w,(int)lVar4);
    local_d9 = (allocator_type)(*piVar2 == *piVar3);
    test((bool *)&local_d9);
    piVar3 = piVar3 + 1;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_04._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_04._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_04._M_current = 3;
  begin_04._M_current[1] = 4;
  begin_04._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,0,2);
  if (w.geometry_.size_ == 8) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
    local_d9 = (allocator_type)(sVar1 == 2);
  }
  else {
    local_d9 = (allocator_type)0x0;
  }
  test((bool *)&local_d9);
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (sVar1 = 0; sVar1 != 4; sVar1 = sVar1 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,sVar1,iVar5);
      local_d9 = (allocator_type)(*piVar2 == (&DAT_001cb690)[(long)(int)lVar4 + sVar1]);
      test((bool *)&local_d9);
    }
    lVar4 = (long)(int)lVar4 + 4;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_05._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_05._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_05._M_current = 3;
  begin_05._M_current[1] = 4;
  begin_05._M_current[2] = 2;
  w.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w,&andres::defaultOrder,
             &local_d9);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,0,2);
  if (w.geometry_.size_ == 8) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
    local_d9 = (allocator_type)(sVar1 == 2);
  }
  else {
    local_d9 = (allocator_type)0x0;
  }
  test((bool *)&local_d9);
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (sVar1 = 0; sVar1 != 4; sVar1 = sVar1 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,sVar1,iVar5);
      local_d9 = (allocator_type)(*piVar2 == (&DAT_001cb6b0)[(long)(int)lVar4 + sVar1]);
      test((bool *)&local_d9);
    }
    lVar4 = (long)(int)lVar4 + 4;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_06._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_06._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_06._M_current = 3;
  begin_06._M_current[1] = 4;
  begin_06._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_06,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&w);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,1,2);
  if (w.geometry_.size_ == 6) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
    local_d9 = (allocator_type)(sVar1 == 2);
  }
  else {
    local_d9 = (allocator_type)0x0;
  }
  test((bool *)&local_d9);
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,sVar1,iVar5);
      local_d9 = (allocator_type)(*piVar2 == (&DAT_001cb4e0)[(long)(int)lVar4 + sVar1]);
      test((bool *)&local_d9);
    }
    lVar4 = (long)(int)lVar4 + 3;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,3,(allocator_type *)&v);
  begin_07._M_current._1_7_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._1_7_;
  begin_07._M_current._0_1_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_1_;
  *begin_07._M_current = 3;
  begin_07._M_current[1] = 4;
  begin_07._M_current[2] = 2;
  w.data_._0_4_ = 0;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_07,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w,&andres::defaultOrder,
             &local_d9);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView(&w,&v,1,2);
  if (w.geometry_.size_ == 6) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&w);
    local_d9 = (allocator_type)(sVar1 == 2);
  }
  else {
    local_d9 = (allocator_type)0x0;
  }
  test((bool *)&local_d9);
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&w,sVar1,iVar5);
      local_d9 = (allocator_type)(*piVar2 == (&DAT_001cb500)[sVar1 + (long)(int)lVar4]);
      test((bool *)&local_d9);
    }
    lVar4 = (long)(int)lVar4 + 3;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,2,(allocator_type *)&v);
  begin_08._M_current._4_4_ = w.data_._4_4_;
  begin_08._M_current._0_4_ = w.data_._0_4_;
  *begin_08._M_current = 1;
  begin_08._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 1) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 0;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = *piVar2 == 0;
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,2,(allocator_type *)&v);
  begin_09._M_current._4_4_ = w.data_._4_4_;
  begin_09._M_current._0_4_ = w.data_._0_4_;
  *begin_09._M_current = 0x18;
  begin_09._M_current[1] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_09,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 0x18) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 1;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,(int)lVar4);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[lVar4];
    test((bool *)&shape);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,3,(allocator_type *)&v);
  begin_10._M_current._4_4_ = w.data_._4_4_;
  begin_10._M_current._0_4_ = w.data_._0_4_;
  *begin_10._M_current = 1;
  begin_10._M_current[1] = 1;
  begin_10._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_10,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 1) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 0;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)&v,0);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = *piVar2 == 0;
  test((bool *)&shape);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,3,(allocator_type *)&v);
  begin_11._M_current._4_4_ = w.data_._4_4_;
  begin_11._M_current._0_4_ = w.data_._0_4_;
  *begin_11._M_current = 1;
  begin_11._M_current[1] = 0x18;
  begin_11._M_current[2] = 1;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_11,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 0x18) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 1;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 1) {
    piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)&v,(int)lVar4);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[lVar4];
    test((bool *)&shape);
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,3,(allocator_type *)&v);
  begin_12._M_current._4_4_ = w.data_._4_4_;
  begin_12._M_current._0_4_ = w.data_._0_4_;
  *begin_12._M_current = 1;
  begin_12._M_current[1] = 3;
  begin_12._M_current[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_12,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 6) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 2;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  lVar4 = 0;
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
      piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar1,iVar5);
      shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[(long)(int)lVar4 + sVar1];
      test((bool *)&shape);
    }
    lVar4 = (long)(int)lVar4 + 3;
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&w,6,(allocator_type *)&v);
  begin_13._M_current._4_4_ = w.data_._4_4_;
  begin_13._M_current._0_4_ = w.data_._0_4_;
  *begin_13._M_current = 1;
  begin_13._M_current[1] = 2;
  begin_13._M_current[2] = 1;
  begin_13._M_current[3] = 1;
  begin_13._M_current[4] = 3;
  begin_13._M_current[5] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,begin_13,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )w.geometry_._0_8_,data,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&shape);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze(&v);
  if (v.geometry_.size_ == 0xc) {
    sVar1 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension(&v);
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = sVar1 == 3;
  }
  else {
    shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = false;
  }
  test((bool *)&shape);
  iVar5 = 0;
  for (args_1 = 0; args_1 != 2; args_1 = args_1 + 1) {
    for (args = 0; args != 3; args = args + 1) {
      for (sVar1 = 0; sVar1 != 2; sVar1 = sVar1 + 1) {
        piVar2 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)&v,sVar1,args,args_1);
        shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = *piVar2 == data[(long)iVar5 + sVar1];
        test((bool *)&shape);
      }
      iVar5 = iVar5 + 2;
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
  return;
}

Assistant:

void ViewTest::coordinateBindingTest() {
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,7);
            test(w.dimension()==0 && w.size()==1);
            test(w(0)==7);
        }
    }
    // 2D with... 
    {
        // bind(0,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,3);
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==3 && w(1)==9 && w(2)==15 && w(3)==21);
        }
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,3);
            
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==12 && w(1)==13 && w(2)==14 && w(3)==15);
        }
        // bind(1,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            int i = 12; 
            for(int x = 0; x < 6; ++x){
                test(w(x) == data_[i]);
                ++i;
            }
        }
        {
            int list[] = {2, 6, 10, 14, 18, 22};
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            for(int x = 0; x < 6; ++x){
                test(w(x) == list[x]);
            }
        }
    }
    // 3D with...
    {
        // bind(0,x)
        {
            int list[] = {2, 5, 8, 11, 14, 17, 20, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,2);
        
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        {
            int list[] = {16, 18, 20, 22, 17, 19, 21, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,2);
            
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        // bind(1,x)
        {
            int list[] = {6, 7, 8, 18, 19, 20};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {4, 12, 20, 5, 13, 21};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);

            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
    }
    // squeeze with...
    {
        // 2D to scalar 
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 1;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();
            
            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        }
        // 2D to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 24;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()== 24 && v.dimension()==1);
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        }
        // 3D to scalar 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        } 
        // 3D to 1D with squeeze
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 24;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==24 && v.dimension()==1
            );
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        } 
        // 3D to 2D
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==6 && v.dimension()==2
            );
            int i = 0; 
            for(int y = 0; y < 2; ++y){
                for(int x = 0; x < 3; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // 6D to 3D
        {
            std::vector<std::size_t> shape(6);
            shape[0] = 1;
            shape[1] = 2;
            shape[2] = 1;
            shape[3] = 1;
            shape[4] = 3;
            shape[5] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==12 && v.dimension()==3
            );
            int i = 0; 
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 3; ++y){
                    for(int x = 0; x < 2; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
}